

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O3

void __thiscall OPN2::setPatch(OPN2 *this,size_t c,OpnTimbre *instrument)

{
  uint8_t *puVar1;
  pointer pOVar2;
  OPNChipBase *pOVar3;
  pointer puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  OpnTimbre *pOVar15;
  
  uVar13 = c / 6;
  uVar9 = c % 6;
  iVar10 = (int)uVar9 + -3;
  if (2 >= uVar9) {
    iVar10 = (int)uVar9;
  }
  uVar9 = (ulong)(2 < uVar9);
  pOVar2 = (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = *(undefined8 *)instrument->OPS;
  uVar6 = *(undefined8 *)(instrument->OPS[1].data + 1);
  uVar7 = *(undefined8 *)(instrument->OPS[3].data + 3);
  puVar1 = pOVar2[c].OPS[2].data + 2;
  *(undefined8 *)puVar1 = *(undefined8 *)(instrument->OPS[2].data + 2);
  *(undefined8 *)(puVar1 + 8) = uVar7;
  pOVar2 = pOVar2 + c;
  *(undefined8 *)pOVar2->OPS = uVar5;
  *(undefined8 *)(pOVar2->OPS[1].data + 1) = uVar6;
  uVar11 = iVar10 + 0x30;
  lVar8 = 0;
  pOVar15 = instrument;
  do {
    lVar14 = -0x1c;
    uVar12 = uVar11;
    do {
      pOVar3 = (this->m_chips).
               super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].m_p;
      (*pOVar3->_vptr_OPNChipBase[0xb])
                (pOVar3,uVar9,(ulong)(uVar12 & 0xff),
                 (ulong)*(uint8_t *)((long)(pOVar15->OPS + 4) + lVar14));
      uVar12 = uVar12 + 4;
      lVar14 = lVar14 + 7;
    } while (lVar14 != 0);
    lVar8 = lVar8 + 1;
    uVar11 = uVar11 + 0x10;
    pOVar15 = (OpnTimbre *)(pOVar15->OPS[0].data + 1);
  } while (lVar8 != 7);
  pOVar3 = (this->m_chips).
           super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar13].m_p;
  (*pOVar3->_vptr_OPNChipBase[0xb])
            (pOVar3,uVar9,(ulong)(iVar10 + 0xb0U & 0xff),(ulong)instrument->fbalg);
  puVar4 = (this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4[c] = instrument->lfosens & 0x3f | puVar4[c] & 0xc0;
  pOVar3 = (this->m_chips).
           super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar13].m_p;
  (*pOVar3->_vptr_OPNChipBase[0xb])
            (pOVar3,uVar9,(ulong)(iVar10 + 0xb4U & 0xff),
             (ulong)(this->m_regLFOSens).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[c]);
  return;
}

Assistant:

void OPN2::setPatch(size_t c, const OpnTimbre &instrument)
{
    size_t      chip;
    uint8_t     port;
    uint32_t    cc;
    getOpnChannel(c, chip, port, cc);
    m_insCache[c] = instrument;
    for(uint8_t d = 0; d < 7; d++)
    {
        for(uint8_t op = 0; op < 4; op++)
            writeRegI(chip, port, 0x30 + (0x10 * d) + (op * 4) + cc, instrument.OPS[op].data[d]);
    }

    writeRegI(chip, port, 0xB0 + cc, instrument.fbalg);//Feedback/Algorithm
    m_regLFOSens[c] = (m_regLFOSens[c] & 0xC0) | (instrument.lfosens & 0x3F);
    writeRegI(chip, port, 0xB4 + cc, m_regLFOSens[c]);//Panorame and LFO bits
}